

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableBase.cpp
# Opt level: O2

void __thiscall adios2::core::VariableBase::CheckDimensions(VariableBase *this,string *hint)

{
  allocator local_11b;
  allocator local_11a;
  allocator local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if ((this->m_ShapeID == GlobalArray) &&
     (((this->m_Start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (this->m_Start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish ||
      ((this->m_Count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (this->m_Count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish)))) {
    std::__cxx11::string::string((string *)&local_58,"Core",&local_119);
    std::__cxx11::string::string((string *)&local_78,"VariableBase",&local_11a);
    std::__cxx11::string::string((string *)&local_98,"CheckDimensions",&local_11b);
    std::operator+(&local_118,"GlobalArray variable ",&this->m_Name);
    std::operator+(&local_f8,&local_118,
                   " start and count dimensions must be defined by either IO.DefineVariable or Variable.SetSelection, "
                  );
    std::operator+(&local_d8,&local_f8,hint);
    std::operator+(&local_b8,&local_d8,"\n");
    helper::Throw<std::invalid_argument>(&local_58,&local_78,&local_98,&local_b8,-1);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::string((string *)&local_38,(string *)hint);
  CheckDimensionsCommon(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void VariableBase::CheckDimensions(const std::string hint) const
{
    if (m_ShapeID == ShapeID::GlobalArray)
    {
        if (m_Start.empty() || m_Count.empty())
        {
            helper::Throw<std::invalid_argument>(
                "Core", "VariableBase", "CheckDimensions",
                "GlobalArray variable " + m_Name +
                    " start and count dimensions must be defined by either "
                    "IO.DefineVariable or Variable.SetSelection, " +
                    hint + "\n");
        }
    }

    CheckDimensionsCommon(hint);
}